

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int mz_zip_reader_locate_file(mz_zip_archive *pZip,char *pName,char *pComment,mz_uint flags)

{
  byte *pbVar1;
  byte bVar2;
  ushort uVar3;
  mz_uint mVar4;
  mz_zip_internal_state *pmVar5;
  void *pvVar6;
  bool bVar7;
  int iVar8;
  size_t sVar9;
  size_t __n;
  int iVar10;
  ulong uVar11;
  size_t sVar12;
  uint uVar13;
  uint uVar14;
  byte bVar15;
  void *pvVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  byte bVar20;
  int iVar21;
  ulong uVar22;
  
  if (((pZip == (mz_zip_archive *)0x0) ||
      (pmVar5 = pZip->m_pState, pName == (char *)0x0 || pmVar5 == (mz_zip_internal_state *)0x0)) ||
     (pZip->m_zip_mode != MZ_ZIP_MODE_READING)) {
    uVar22 = 0xffffffff;
    goto LAB_0019bf0d;
  }
  if ((pComment == (char *)0x0 && (flags & 0x300) == 0) &&
     ((pmVar5->m_sorted_central_dir_offsets).m_size != 0)) {
    pvVar6 = (pmVar5->m_sorted_central_dir_offsets).m_p;
    mVar4 = pZip->m_total_files;
    sVar9 = strlen(pName);
    iVar8 = mVar4 - 1;
    iVar10 = 0;
    while (iVar21 = iVar8, iVar10 <= iVar21) {
      uVar13 = (uint)(iVar10 + iVar21) >> 1;
      uVar22 = (ulong)*(uint *)((long)pvVar6 + (ulong)uVar13 * 4);
      pvVar16 = (pmVar5->m_central_dir).m_p;
      uVar11 = (ulong)*(uint *)((long)(pmVar5->m_central_dir_offsets).m_p + uVar22 * 4);
      uVar3 = *(ushort *)((long)pvVar16 + uVar11 + 0x1c);
      uVar17 = (ulong)uVar3;
      if ((uint)sVar9 <= (uint)uVar3) {
        uVar17 = sVar9 & 0xffffffff;
      }
      bVar15 = 0;
      for (uVar18 = 0; pbVar1 = (byte *)((long)pvVar16 + uVar18 + uVar11 + 0x2e), bVar20 = bVar15,
          pbVar1 < (byte *)((long)pvVar16 + uVar17 + uVar11 + 0x2e); uVar18 = uVar18 + 1) {
        bVar15 = *pbVar1;
        bVar20 = bVar15 + 0x20;
        if (0x19 < (byte)(bVar15 + 0xbf)) {
          bVar20 = bVar15;
        }
        bVar2 = pName[uVar18];
        bVar15 = bVar2 + 0x20;
        if (0x19 < (byte)(bVar2 + 0xbf)) {
          bVar15 = bVar2;
        }
        if (bVar20 != bVar15) break;
        bVar15 = bVar20;
      }
      iVar19 = (uint)bVar20 - (uint)bVar15;
      if (uVar17 == uVar18) {
        iVar19 = (uint)uVar3 - (uint)sVar9;
      }
      if (iVar19 == 0) goto LAB_0019bf0d;
      iVar8 = uVar13 - 1;
      if (iVar19 < 0) {
        iVar8 = iVar21;
        iVar10 = uVar13 + 1;
      }
    }
  }
  else {
    sVar9 = strlen(pName);
    if (sVar9 < 0x10000) {
      if (pComment == (char *)0x0) {
        __n = 0;
      }
      else {
        __n = strlen(pComment);
        if (0xffff < __n) goto LAB_0019bf5d;
      }
      uVar13 = pZip->m_total_files;
      for (uVar22 = 0; uVar22 != uVar13; uVar22 = uVar22 + 1) {
        pvVar6 = (pmVar5->m_central_dir).m_p;
        uVar11 = (ulong)*(uint *)((long)(pmVar5->m_central_dir_offsets).m_p + uVar22 * 4);
        uVar3 = *(ushort *)((long)pvVar6 + uVar11 + 0x1c);
        uVar17 = (ulong)uVar3;
        if (sVar9 <= uVar17) {
          pvVar16 = (void *)((long)pvVar6 + uVar11 + 0x2e);
          if (__n == 0) {
LAB_0019c04b:
            if (((flags >> 9 & 1) != 0) && (uVar3 != 0)) {
              do {
                uVar14 = *(byte *)((long)pvVar16 + (uVar17 - 1 & 0xffffffff)) - 0x2f;
                if ((uVar14 < 0x2e) && ((0x200000000801U >> ((ulong)uVar14 & 0x3f) & 1) != 0))
                goto LAB_0019c08d;
                bVar7 = 1 < (long)uVar17;
                uVar17 = uVar17 - 1;
              } while (bVar7);
              uVar17 = 0;
LAB_0019c08d:
              pvVar16 = (void *)((long)pvVar16 + (uVar17 & 0xffffffff));
              uVar17 = (ulong)((uint)uVar3 - (int)uVar17);
            }
            if (sVar9 == uVar17) {
              if ((flags >> 8 & 1) == 0) {
                sVar12 = 0;
                do {
                  if (sVar9 == sVar12) goto LAB_0019bf0d;
                  bVar15 = pName[sVar12];
                  iVar8 = bVar15 + 0x20;
                  if (0x19 < (byte)(bVar15 + 0xbf)) {
                    iVar8 = (int)(char)bVar15;
                  }
                  bVar15 = *(byte *)((long)pvVar16 + sVar12);
                  iVar10 = bVar15 + 0x20;
                  if (0x19 < (byte)(bVar15 + 0xbf)) {
                    iVar10 = (int)(char)bVar15;
                  }
                  sVar12 = sVar12 + 1;
                } while (iVar8 == iVar10);
              }
              else {
                iVar8 = bcmp(pName,pvVar16,sVar9);
                if (iVar8 == 0) goto LAB_0019bf0d;
              }
            }
          }
          else if (__n == *(ushort *)((long)pvVar6 + uVar11 + 0x20)) {
            uVar18 = (ulong)*(ushort *)((long)pvVar6 + uVar11 + 0x1e);
            if ((flags >> 8 & 1) == 0) {
              sVar12 = 0;
              do {
                if (__n == sVar12) goto LAB_0019c04b;
                bVar15 = pComment[sVar12];
                iVar8 = bVar15 + 0x20;
                if (0x19 < (byte)(bVar15 + 0xbf)) {
                  iVar8 = (int)(char)bVar15;
                }
                bVar15 = *(byte *)((long)pvVar6 + sVar12 + uVar11 + uVar18 + uVar17 + 0x2e);
                iVar10 = bVar15 + 0x20;
                if (0x19 < (byte)(bVar15 + 0xbf)) {
                  iVar10 = (int)(char)bVar15;
                }
                sVar12 = sVar12 + 1;
              } while (iVar8 == iVar10);
            }
            else {
              iVar8 = bcmp(pComment,(void *)((long)pvVar16 + uVar17 + uVar18),__n);
              if (iVar8 == 0) goto LAB_0019c04b;
            }
          }
        }
      }
      uVar22 = 0xffffffff;
      goto LAB_0019bf0d;
    }
  }
LAB_0019bf5d:
  uVar22 = 0xffffffff;
LAB_0019bf0d:
  return (int)uVar22;
}

Assistant:

int mz_zip_reader_locate_file(mz_zip_archive *pZip, const char *pName,
                              const char *pComment, mz_uint flags) {
  mz_uint file_index;
  size_t name_len, comment_len;
  if ((!pZip) || (!pZip->m_pState) || (!pName) ||
      (pZip->m_zip_mode != MZ_ZIP_MODE_READING))
    return -1;
  if (((flags & (MZ_ZIP_FLAG_IGNORE_PATH | MZ_ZIP_FLAG_CASE_SENSITIVE)) == 0) &&
      (!pComment) && (pZip->m_pState->m_sorted_central_dir_offsets.m_size))
    return mz_zip_reader_locate_file_binary_search(pZip, pName);
  name_len = strlen(pName);
  if (name_len > 0xFFFF)
    return -1;
  comment_len = pComment ? strlen(pComment) : 0;
  if (comment_len > 0xFFFF)
    return -1;
  for (file_index = 0; file_index < pZip->m_total_files; file_index++) {
    const mz_uint8 *pHeader =
        &MZ_ZIP_ARRAY_ELEMENT(
            &pZip->m_pState->m_central_dir, mz_uint8,
            MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets,
                                 mz_uint32, file_index));
    mz_uint filename_len = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_FILENAME_LEN_OFS);
    const char *pFilename =
        (const char *)pHeader + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE;
    if (filename_len < name_len)
      continue;
    if (comment_len) {
      mz_uint file_extra_len = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_EXTRA_LEN_OFS),
              file_comment_len =
                  MZ_READ_LE16(pHeader + MZ_ZIP_CDH_COMMENT_LEN_OFS);
      const char *pFile_comment = pFilename + filename_len + file_extra_len;
      if ((file_comment_len != comment_len) ||
          (!mz_zip_reader_string_equal(pComment, pFile_comment,
                                       file_comment_len, flags)))
        continue;
    }
    if ((flags & MZ_ZIP_FLAG_IGNORE_PATH) && (filename_len)) {
      int ofs = filename_len - 1;
      do {
        if ((pFilename[ofs] == '/') || (pFilename[ofs] == '\\') ||
            (pFilename[ofs] == ':'))
          break;
      } while (--ofs >= 0);
      ofs++;
      pFilename += ofs;
      filename_len -= ofs;
    }
    if ((filename_len == name_len) &&
        (mz_zip_reader_string_equal(pName, pFilename, filename_len, flags)))
      return file_index;
  }
  return -1;
}